

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>
::
Naive_vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<int,std::allocator<int>>>
          (Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>
           *this,Index columnIndex,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *nonZeroRowIndices,
          vector<int,_std::allocator<int>_> *rowContainer,Column_settings *colSettings)

{
  vector<int,_std::allocator<int>_> *this_00;
  bool bVar1;
  uint pivot;
  size_type sVar2;
  reference puVar3;
  Dimension local_88;
  const_iterator cStack_60;
  ID_index id;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4;
  value_type pEStack_40;
  Index i;
  anon_class_8_1_c18eeb02 local_38;
  Column_settings *local_30;
  Column_settings *colSettings_local;
  vector<int,_std::allocator<int>_> *rowContainer_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *nonZeroRowIndices_local;
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>
  *pNStack_10;
  Index columnIndex_local;
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>
  *this_local;
  
  local_30 = colSettings;
  colSettings_local = (Column_settings *)rowContainer;
  rowContainer_local = (vector<int,_std::allocator<int>_> *)nonZeroRowIndices;
  nonZeroRowIndices_local._4_4_ = columnIndex;
  pNStack_10 = this;
  Dummy_row_access::Dummy_row_access<unsigned_int,std::vector<int,std::allocator<int>>*>
            ((Dummy_row_access *)this,columnIndex,
             (vector<int,_std::allocator<int>_> **)&colSettings_local);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)rowContainer_local);
  if (sVar2 == 0) {
    local_88 = 0;
  }
  else {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)rowContainer_local);
    local_88 = (int)sVar2 + -1;
  }
  Column_dimension_holder<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>
  ::Column_dimension_holder
            ((Column_dimension_holder<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>
              *)this,local_88);
  local_38.nonZeroRowIndices =
       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)rowContainer_local;
  pivot = Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>
          ::
          Naive_vector_column<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<int,_std::allocator<int>_>_>
          ::anon_class_8_1_c18eeb02::operator()(&local_38);
  Dummy_chain_properties::Dummy_chain_properties((Dummy_chain_properties *)this,pivot,0);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)rowContainer_local);
  pEStack_40 = (value_type)0x0;
  boost::container::
  small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>
  ::small_vector((small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>
                  *)(this + 8),sVar2,&stack0xffffffffffffffc0);
  this_00 = rowContainer_local;
  *(undefined8 *)(this + 0x60) = 0;
  *(Column_settings **)(this + 0x68) = local_30;
  __range4._4_4_ = 0;
  __end0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)rowContainer_local);
  cStack_60 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffffa0);
    if (!bVar1) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end0);
    Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>
    ::_update_entry((Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>
                     *)this,*puVar3,__range4._4_4_);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end0);
    __range4._4_4_ = __range4._4_4_ + 1;
  }
  return;
}

Assistant:

inline Naive_vector_column<Master_matrix,Support>::Naive_vector_column(Index columnIndex,
                                                               const Container& nonZeroRowIndices,
                                                               Row_container* rowContainer,
                                                               Column_settings* colSettings)
    : RA_opt(columnIndex, rowContainer),
      Dim_opt(nonZeroRowIndices.size() == 0 ? 0 : nonZeroRowIndices.size() - 1),
      Chain_opt([&] {
        if constexpr (Master_matrix::Option_list::is_z2) {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : *std::prev(nonZeroRowIndices.end());
        } else {
          return nonZeroRowIndices.begin() == nonZeroRowIndices.end()
                     ? Master_matrix::template get_null_value<ID_index>()
                     : std::prev(nonZeroRowIndices.end())->first;
        }
      }()),
      column_(nonZeroRowIndices.size(), nullptr),
      operators_(nullptr),
      entryPool_(&(colSettings->entryConstructor))
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Constructor not available for chain columns, please specify the dimension of the chain.");

  Index i = 0;
  if constexpr (Master_matrix::Option_list::is_z2) {
    for (ID_index id : nonZeroRowIndices) {
      _update_entry(id, i++);
    }
  } else {
    operators_ = &(colSettings->operators);
    for (const auto& p : nonZeroRowIndices) {
      _update_entry(operators_->get_value(p.second), p.first, i++);
    }
  }
}